

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void printPredictions(vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *predictions,bool printProb,bool multiline)

{
  pointer ppVar1;
  bool bVar2;
  pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *prediction;
  pointer ppVar3;
  
  ppVar3 = (predictions->
           super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (predictions->
           super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 != ppVar1) {
    bVar2 = true;
    do {
      if (!bVar2 && !multiline) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(ppVar3->second)._M_dataplus._M_p,
                 (ppVar3->second)._M_string_length);
      if (printProb) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        std::ostream::_M_insert<double>((double)ppVar3->first);
      }
      if (multiline) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
      }
      ppVar3 = ppVar3 + 1;
      bVar2 = false;
    } while (ppVar3 != ppVar1);
  }
  if (multiline) {
    return;
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  return;
}

Assistant:

void printPredictions(
    const std::vector<std::pair<real, std::string>>& predictions,
    bool printProb,
    bool multiline) {
  bool first = true;
  for (const auto& prediction : predictions) {
    if (!first && !multiline) {
      std::cout << " ";
    }
    first = false;
    std::cout << prediction.second;
    if (printProb) {
      std::cout << " " << prediction.first;
    }
    if (multiline) {
      std::cout << std::endl;
    }
  }
  if (!multiline) {
    std::cout << std::endl;
  }
}